

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O2

void __thiscall curlpp::internal::OptionList::setOpt(OptionList *this,OptionList *options)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  for (p_Var2 = (options->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(options->mOptions)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    uVar1 = (**(code **)(*(long *)p_Var2[1]._M_parent + 0x18))();
    (*this->_vptr_OptionList[2])(this,uVar1);
  }
  return;
}

Assistant:

void OptionList::setOpt(const OptionList & options)
{
  for(mapType::const_iterator pos = options.mOptions.begin();
      pos != options.mOptions.end();
      pos++)
   {
     setOpt(pos->second->clone());
   }  
}